

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_HTML.h
# Opt level: O1

HTMLElement * __thiscall choc::html::HTMLElement::addSpan(HTMLElement *this,string_view classToUse)

{
  pointer pHVar1;
  HTMLElement *pHVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"span","");
  std::vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>>::
  emplace_back<std::__cxx11::string>
            ((vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>> *)
             &this->children,&local_48);
  pHVar1 = (this->children).
           super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pHVar1[-1].contentIsInline = true;
  pHVar2 = setClass(pHVar1 + -1,classToUse);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return pHVar2;
}

Assistant:

HTMLElement& addSpan (std::string_view classToUse)  { return addChild ("span").setInline (true).setClass (classToUse); }